

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_utils.c
# Opt level: O0

int is_absolute_path(char *p)

{
  char *p_local;
  
  p_local._4_4_ = (uint)(*p == '/');
  return p_local._4_4_;
}

Assistant:

PRIVATE int
is_absolute_path(const char *p)
{
  if (*p == DIRSEPC)
    return 1;

#ifdef _WIN32
  if (is_drive_char((const char)*p) && (strlen(p) > 3))
    if ((*(p + 1) == ':') && ((*(p + 2) == '\\') || (*(p + 2) == '/')))
      return 1;

#endif
  return 0;
}